

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGenerateMipMap.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArrayGenerateMipMapFilterable::generateTestData
          (TextureCubeMapArrayGenerateMipMapFilterable *this,int n_layer,uchar *data,int width,
          int height)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int y;
  ulong uVar7;
  
  uVar4 = 0;
  uVar5 = (ulong)(uint)height;
  if (height < 1) {
    uVar5 = 0;
  }
  uVar6 = 0;
  if (0 < width) {
    uVar6 = width;
  }
  for (uVar2 = 0; uVar2 != uVar6; uVar2 = uVar2 + 1) {
    uVar3 = uVar4;
    for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
      for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
        data[lVar1 + (ulong)uVar3] =
             *(uchar *)((long)&m_layer_face_data +
                       lVar1 + ((long)(int)((uVar2 & 1) + (int)uVar7) % 2 & 0xffffffffU) * 4 +
                               (long)n_layer * 8);
      }
      uVar3 = uVar3 + width * 4;
    }
    uVar4 = uVar4 + 4;
  }
  return;
}

Assistant:

void TextureCubeMapArrayGenerateMipMapFilterable::generateTestData(int n_layer, unsigned char* data, int width,
																   int height)
{
	DE_ASSERT(data != DE_NULL);

	for (int x = 0; x < width; ++x)
	{
		for (int y = 0; y < height; ++y)
		{
			for (int n_component = 0; n_component < m_n_components; ++n_component)
			{
				const unsigned int pixel_size = m_n_components;
				unsigned char*	 result_ptr = data + ((y * width + x) * pixel_size + n_component);
				unsigned int	   n_color	= ((x % m_n_colors_per_layer_face) + y) % m_n_colors_per_layer_face;

				*result_ptr = m_layer_face_data[n_layer][n_color][n_component];
			}
		}
	}
}